

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescription(Storyboard *this,string *description)

{
  ostream *poVar1;
  
  poVar1 = ::std::operator<<((ostream *)&this->field_0x10,(string *)description);
  ::std::operator<<(poVar1,"\n");
  this->addNewLineBeforeNextFrame_ = true;
  return this;
}

Assistant:

Storyboard& Storyboard::addDescription(const std::string& description)
    {
        output_ << description << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }